

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[6],char_const(&)[22],std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [6],char (*u) [22],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char (*args_1) [6]
          ,Newline *args_2)

{
  size_t size;
  
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"bool ",5);
  size = strlen(*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*t,size);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*(char **)*u,*(size_t *)(*u + 8));
  anon_unknown_0::CWriter::WriteData((CWriter *)this," : 1;",5);
  if (*(int *)(this + 0x94) < 2) {
    anon_unknown_0::CWriter::WriteData((CWriter *)this,"\n",1);
    *(int *)(this + 0x94) = *(int *)(this + 0x94) + 1;
  }
  this[0x90] = (CWriter)0x1;
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }